

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_test.cpp
# Opt level: O2

void __thiscall
biosoup::test::BiosoupSequenceTest_ReverseAndComplement_Test::TestBody
          (BiosoupSequenceTest_ReverseAndComplement_Test *this)

{
  char *pcVar1;
  allocator local_d3;
  allocator local_d2;
  allocator local_d1;
  AssertionResult gtest_ar;
  string local_b0;
  string local_90;
  Sequence s;
  
  std::__cxx11::string::string((string *)&gtest_ar,"Test",&local_d1);
  std::__cxx11::string::string((string *)&local_b0,"ACGTURYKMSWBDHVN",&local_d2);
  std::__cxx11::string::string((string *)&local_90,"0123456789:;<=>?",&local_d3);
  Sequence::Sequence(&s,(string *)&gtest_ar,&local_b0,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&gtest_ar);
  Sequence::ReverseAndComplement(&s);
  local_b0._M_dataplus._M_p._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&gtest_ar,"0","s.id",(int *)&local_b0,&s.id);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_b0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/sequence_test.cpp"
               ,0xf,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((long *)CONCAT44(local_b0._M_dataplus._M_p._4_4_,local_b0._M_dataplus._M_p._0_4_) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_b0._M_dataplus._M_p._4_4_,local_b0._M_dataplus._M_p._0_4_
                                    ) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperEQ<char[17],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"NBDHVWSKMRYAACGT\"","s.data",(char (*) [17])"NBDHVWSKMRYAACGT"
             ,&s.data);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_b0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/sequence_test.cpp"
               ,0x10,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((long *)CONCAT44(local_b0._M_dataplus._M_p._4_4_,local_b0._M_dataplus._M_p._0_4_) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_b0._M_dataplus._M_p._4_4_,local_b0._M_dataplus._M_p._0_4_
                                    ) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperEQ<char[17],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"?>=<;:9876543210\"","s.quality",
             (char (*) [17])"?>=<;:9876543210",&s.quality);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_b0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/sequence_test.cpp"
               ,0x11,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((long *)CONCAT44(local_b0._M_dataplus._M_p._4_4_,local_b0._M_dataplus._M_p._0_4_) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_b0._M_dataplus._M_p._4_4_,local_b0._M_dataplus._M_p._0_4_
                                    ) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  Sequence::~Sequence(&s);
  return;
}

Assistant:

TEST(BiosoupSequenceTest, ReverseAndComplement) {
  Sequence s{"Test", "ACGTURYKMSWBDHVN", "0123456789:;<=>?"};
  s.ReverseAndComplement();
  EXPECT_EQ(0, s.id);
  EXPECT_EQ("NBDHVWSKMRYAACGT", s.data);
  EXPECT_EQ("?>=<;:9876543210", s.quality);
}